

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::CullDistance::APICoverageTest::iterate(APICoverageTest *this)

{
  ulong uVar1;
  TestContext *testCtx;
  GLchar *pGVar2;
  Functions *gl_00;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *pCVar7;
  NotSupportedError *this_00;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  Enum<int,_2UL> EVar15;
  GLuint local_e48;
  GLchar *local_d98;
  GLchar *local_d88;
  GLchar *local_d78;
  GLchar *local_d68;
  GLchar *local_d58;
  GLchar *local_d48;
  GLuint local_cac;
  GLint aGStack_c18 [2];
  GLint clear_values [4];
  MessageBuilder local_c00;
  MessageBuilder local_a80;
  int local_8fc;
  GLuint local_8f8;
  GLint result_value;
  GLuint to_id;
  GLuint n_stage_internal;
  MessageBuilder local_770;
  int *local_5f0;
  GLint *result_data_ptr;
  GLchar **local_5e0;
  _token_value_pair *current_pair;
  undefined8 uStack_5d0;
  GLuint n_pair;
  size_t n_token_value_pairs;
  _token_value_pair token_value_pairs [2];
  _shader_body *current_body;
  GLuint n_shader_body;
  size_t token_position;
  _shader_body shader_bodies [6];
  _stage *current_stage;
  string local_518 [8];
  string vs_body;
  string local_4f0 [8];
  string te_body;
  string local_4c8 [8];
  string tc_body;
  string local_4a0 [8];
  string gs_body;
  string local_478 [8];
  string fs_body;
  string local_450 [8];
  string cs_body;
  uint local_420;
  GLuint n_stage;
  GLuint n_stages;
  _run *current_run;
  GLuint n_run;
  _run runs [2];
  GLuint n_to_id;
  Enum<int,_2UL> local_3b0;
  MessageBuilder local_3a0;
  GetNameFunc local_220;
  int local_218;
  Enum<int,_2UL> local_210;
  MessageBuilder local_200;
  GLint local_7c;
  GLint local_78;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLint gl_max_cull_distances_value;
  GLint error_code;
  allocator<char> local_59;
  string local_58;
  deUint32 local_38;
  ContextType local_34;
  Functions *local_30;
  Functions *gl;
  APICoverageTest *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  local_30 = (Functions *)CONCAT44(extraout_var,iVar4);
  pCVar7 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar7,"GL_ARB_cull_distance");
  if (!bVar3) {
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    local_34.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
    local_38 = (deUint32)glu::ApiType::core(4,5);
    bVar3 = glu::contextSupports(local_34,(ApiType)local_38);
    if (!bVar3) {
      gl_max_cull_distances_value._3_1_ = 1;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"GL_ARB_cull_distance is not supported",&local_59);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
      gl_max_cull_distances_value._3_1_ = 0;
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  gl_max_combined_clip_and_cull_distances_value = 0;
  local_78 = 0;
  local_7c = 0;
  (*local_30->getIntegerv)(0x82f9,&local_78);
  gl_max_combined_clip_and_cull_distances_value = (*local_30->getError)();
  if (gl_max_combined_clip_and_cull_distances_value == 0) {
    (*local_30->getIntegerv)(0x82fa,&local_7c);
    gl_max_combined_clip_and_cull_distances_value = (*local_30->getError)();
    if (gl_max_combined_clip_and_cull_distances_value == 0) {
      (*local_30->genBuffers)(1,&this->m_bo_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1dc);
      (*local_30->genFramebuffers)(1,&this->m_fbo_draw_id);
      (*local_30->genFramebuffers)(1,&this->m_fbo_read_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glGenFramebuffers() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e0);
      (*local_30->genTextures)(1,&this->m_cs_to_id);
      (*local_30->genTextures)(1,&this->m_fbo_draw_to_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e4);
      (*local_30->genVertexArrays)(1,&this->m_vao_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e7);
      (*local_30->bindVertexArray)(this->m_vao_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ea);
      (*local_30->bindBuffer)(0x8c8e,this->m_bo_id);
      (*local_30->bindBufferBase)(0x8c8e,0,this->m_bo_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBindBuffer() or glBindBufferBase() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ef);
      (*local_30->bufferData)(0x8c8e,0x40,(void *)0x0,0x88e4);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1f2);
      for (runs[1].name._4_4_ = 0; runs[1].name._4_4_ < 2;
          runs[1].name._4_4_ = runs[1].name._4_4_ + 1) {
        if (runs[1].name._4_4_ == 0) {
          local_cac = this->m_cs_to_id;
        }
        else {
          local_cac = this->m_fbo_draw_to_id;
        }
        (*local_30->bindTexture)(0xde1,local_cac);
        GVar5 = (*local_30->getError)();
        glu::checkError(GVar5,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1f7);
        (*local_30->texStorage2D)(0xde1,1,0x8235,1,1);
        GVar5 = (*local_30->getError)();
        glu::checkError(GVar5,"glTexStorage2D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1fc);
      }
      (*local_30->bindImageTexture)(0,this->m_cs_to_id,0,'\0',0,0x88b9,0x8235);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBindImageTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x204);
      (*local_30->bindFramebuffer)(0x8ca9,this->m_fbo_draw_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x207);
      (*local_30->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,this->m_fbo_draw_to_id,0);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20a);
      (*local_30->bindFramebuffer)(0x8ca8,this->m_fbo_read_id);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20d);
      (*local_30->viewport)(0,0,1,1);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glViewport() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x213);
      (*local_30->pixelStorei)(0xd05,1);
      GVar5 = (*local_30->getError)();
      glu::checkError(GVar5,"glPixelStorei() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x216);
      runs[0].essl_token_value._0_4_ = 0x82f9;
      runs[0].essl_token_value._4_4_ = local_78;
      runs[0].gl_enum = 8;
      runs[0]._16_8_ = anon_var_dwarf_42f8e;
      runs[0].name = "gl_MaxCombinedClipAndCullDistances";
      runs[1].essl_token_value._0_4_ = 0x82fa;
      runs[1].essl_token_value._4_4_ = local_7c;
      runs[1].gl_enum = 8;
      runs[1]._16_8_ = anon_var_dwarf_42fb0;
      for (current_run._4_4_ = 0; current_run._4_4_ < 2; current_run._4_4_ = current_run._4_4_ + 1)
      {
        uVar13 = (ulong)current_run._4_4_;
        for (local_420 = 0; local_420 < 5; local_420 = local_420 + 1) {
          if ((iterate::stages[local_420].use_cs & 1U) == 0) {
LAB_00dfb526:
            if (((iterate::stages[local_420].use_tc & 1U) != 0) ||
               ((iterate::stages[local_420].use_te & 1U) != 0)) {
              pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
              cs_body.field_2._12_4_ = (*pRVar6->_vptr_RenderContext[2])();
              cs_body.field_2._8_4_ = glu::ApiType::core(4,0);
              bVar3 = glu::contextSupports
                                ((ContextType)cs_body.field_2._12_4_,(ApiType)cs_body.field_2._8_4_)
              ;
              if (!bVar3) {
                pCVar7 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
                bVar3 = glu::ContextInfo::isExtensionSupported(pCVar7,"GL_ARB_tessellation_shader");
                if (!bVar3) goto LAB_00dfca82;
              }
            }
            pGVar2 = iterate::cs_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_450,pGVar2,(allocator<char> *)(fs_body.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(fs_body.field_2._M_local_buf + 0xf));
            pGVar2 = iterate::fs_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_478,pGVar2,(allocator<char> *)(gs_body.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(gs_body.field_2._M_local_buf + 0xf));
            pGVar2 = iterate::gs_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_4a0,pGVar2,(allocator<char> *)(tc_body.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(tc_body.field_2._M_local_buf + 0xf));
            pGVar2 = iterate::tc_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_4c8,pGVar2,(allocator<char> *)(te_body.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(te_body.field_2._M_local_buf + 0xf));
            pGVar2 = iterate::te_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_4f0,pGVar2,(allocator<char> *)(vs_body.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(vs_body.field_2._M_local_buf + 0xf));
            pGVar2 = iterate::vs_body_template;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_518,pGVar2,(allocator<char> *)((long)&current_stage + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&current_stage + 7));
            shader_bodies[5]._8_8_ = iterate::stages + local_420;
            shader_bodies[0].body_ptr._0_4_ = 0x91b9;
            shader_bodies[0]._8_8_ = local_478;
            shader_bodies[1].body_ptr._0_4_ = 0x8b30;
            shader_bodies[1]._8_8_ = local_4a0;
            shader_bodies[2].body_ptr._0_4_ = 0x8dd9;
            shader_bodies[2]._8_8_ = local_4c8;
            shader_bodies[3].body_ptr._0_4_ = 0x8e88;
            shader_bodies[3]._8_8_ = local_4f0;
            shader_bodies[4].body_ptr._0_4_ = 0x8e87;
            shader_bodies[4]._8_8_ = local_518;
            shader_bodies[5].body_ptr._0_4_ = 0x8b31;
            for (current_body._4_4_ = 0; gl_00 = local_30, current_body._4_4_ < 6;
                current_body._4_4_ = current_body._4_4_ + 1) {
              uVar14 = (ulong)current_body._4_4_;
              if (((((*(int *)&shader_bodies[uVar14].body_ptr != 0x91b9) ||
                    ((*(byte *)shader_bodies[5]._8_8_ & 1) != 0)) &&
                   ((*(int *)&shader_bodies[uVar14].body_ptr != 0x8b30 ||
                    ((*(byte *)(shader_bodies[5]._8_8_ + 1) & 1) != 0)))) &&
                  (((*(int *)&shader_bodies[uVar14].body_ptr != 0x8e88 ||
                    ((*(byte *)(shader_bodies[5]._8_8_ + 3) & 1) != 0)) &&
                   ((*(int *)&shader_bodies[uVar14].body_ptr != 0x8e87 ||
                    ((*(byte *)(shader_bodies[5]._8_8_ + 4) & 1) != 0)))))) &&
                 ((*(int *)&shader_bodies[uVar14].body_ptr != 0x8b31 ||
                  ((*(byte *)(shader_bodies[5]._8_8_ + 5) & 1) != 0)))) {
                n_token_value_pairs = (size_t)iterate::token_string;
                token_value_pairs[0].token = runs[uVar13 - 1].name;
                token_value_pairs[0].value = (GLchar *)0x0;
                token_value_pairs[1].token = (GLchar *)0x0;
                uStack_5d0 = 2;
                iVar4 = *(int *)&shader_bodies[uVar14].body_ptr;
                if (iVar4 == 0x8b30) {
                  token_value_pairs[0].value = iterate::input_fs_token_string;
                  token_value_pairs[1].token = *(GLchar **)(shader_bodies[5]._8_8_ + 8);
                }
                else if (iVar4 != 0x8b31) {
                  if (iVar4 == 0x8dd9) {
                    token_value_pairs[0].value = iterate::input_gs_token_string;
                    token_value_pairs[1].token = *(GLchar **)(shader_bodies[5]._8_8_ + 0x10);
                  }
                  else if (iVar4 == 0x8e87) {
                    token_value_pairs[0].value = iterate::input_te_token_string;
                    token_value_pairs[1].token = *(GLchar **)(shader_bodies[5]._8_8_ + 0x20);
                  }
                  else if (iVar4 == 0x8e88) {
                    token_value_pairs[0].value = iterate::input_tc_token_string;
                    token_value_pairs[1].token = *(GLchar **)(shader_bodies[5]._8_8_ + 0x18);
                  }
                  else if (iVar4 != 0x91b9) {
                    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar10,"Unrecognized shader body type",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                               ,0x379);
                    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                  }
                }
                for (current_pair._4_4_ = 0; current_pair._4_4_ < 2;
                    current_pair._4_4_ = current_pair._4_4_ + 1) {
                  local_5e0 = &token_value_pairs[(ulong)current_pair._4_4_ - 1].value;
                  if ((*local_5e0 != (GLchar *)0x0) &&
                     (token_value_pairs[current_pair._4_4_].token != (GLchar *)0x0)) {
                    while (uVar11 = std::__cxx11::string::find
                                              (*(char **)&shader_bodies[uVar14 - 1].gl_type,
                                               (ulong)*local_5e0), uVar11 != 0xffffffffffffffff) {
                      uVar1 = *(ulong *)&shader_bodies[uVar14 - 1].gl_type;
                      pcVar12 = (char *)strlen(*local_5e0);
                      std::__cxx11::string::replace(uVar1,uVar11,pcVar12);
                    }
                  }
                }
              }
            }
            testCtx = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            if ((*(byte *)shader_bodies[5]._8_8_ & 1) == 0) {
              local_d48 = (GLchar *)0x0;
            }
            else {
              local_d48 = (GLchar *)std::__cxx11::string::c_str();
            }
            if ((*(byte *)(shader_bodies[5]._8_8_ + 1) & 1) == 0) {
              local_d58 = (GLchar *)0x0;
            }
            else {
              local_d58 = (GLchar *)std::__cxx11::string::c_str();
            }
            if ((*(byte *)(shader_bodies[5]._8_8_ + 2) & 1) == 0) {
              local_d68 = (GLchar *)0x0;
            }
            else {
              local_d68 = (GLchar *)std::__cxx11::string::c_str();
            }
            if ((*(byte *)(shader_bodies[5]._8_8_ + 3) & 1) == 0) {
              local_d78 = (GLchar *)0x0;
            }
            else {
              local_d78 = (GLchar *)std::__cxx11::string::c_str();
            }
            if ((*(byte *)(shader_bodies[5]._8_8_ + 4) & 1) == 0) {
              local_d88 = (GLchar *)0x0;
            }
            else {
              local_d88 = (GLchar *)std::__cxx11::string::c_str();
            }
            if ((*(byte *)(shader_bodies[5]._8_8_ + 5) & 1) == 0) {
              local_d98 = (GLchar *)0x0;
            }
            else {
              local_d98 = (GLchar *)std::__cxx11::string::c_str();
            }
            result_data_ptr._4_4_ = (uint)(*(long *)(shader_bodies[5]._8_8_ + 0x28) != 0);
            Utilities::buildProgram
                      (gl_00,testCtx,local_d48,local_d58,local_d68,local_d78,local_d88,local_d98,
                       (GLuint *)((long)&result_data_ptr + 4),
                       (GLchar **)(shader_bodies[5]._8_8_ + 0x28),&this->m_po_id);
            (*local_30->useProgram)(this->m_po_id);
            GVar5 = (*local_30->getError)();
            glu::checkError(GVar5,"glUseProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x398);
            if ((*(byte *)shader_bodies[5]._8_8_ & 1) == 0) {
              (*local_30->beginTransformFeedback)(*(GLenum *)(shader_bodies[5]._8_8_ + 0x30));
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glBeginTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a1);
              (*local_30->drawArrays)
                        (*(GLenum *)(shader_bodies[5]._8_8_ + 0x34),0,
                         *(GLsizei *)(shader_bodies[5]._8_8_ + 0x38));
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glDrawArrays() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a5);
              (*local_30->endTransformFeedback)();
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glEndTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a8);
            }
            else {
              (*local_30->dispatchCompute)(1,1,1);
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glDispatchCompute() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3af);
            }
            if ((*(byte *)shader_bodies[5]._8_8_ & 1) == 0) {
              local_5f0 = (int *)0x0;
              local_5f0 = (int *)(*local_30->mapBufferRange)(0x8c8e,0,4,1);
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glMapBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3ba);
              if (*local_5f0 != *(int *)((long)&runs[uVar13].essl_token_value + 4)) {
                pTVar8 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_770,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar9 = tcu::MessageBuilder::operator<<
                                   (&local_770,(char **)&runs[uVar13].min_value);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])0x2aebc68);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_5f0);
                pMVar9 = tcu::MessageBuilder::operator<<
                                   (pMVar9,(char (*) [55])
                                           "] does not match the one reported by glGetIntegerv() [")
                ;
                pMVar9 = tcu::MessageBuilder::operator<<
                                   (pMVar9,(int *)((long)&runs[uVar13].essl_token_value + 4));
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_770);
                pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar10,"GL constant value does not match the ES SL equivalent",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3c5);
                __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              if (*local_5f0 < (int)runs[uVar13].gl_enum) {
                pTVar8 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          ((MessageBuilder *)&to_id,pTVar8,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar9 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)&to_id,(char **)&runs[uVar13].min_value);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])0x2aebc68);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_5f0);
                pMVar9 = tcu::MessageBuilder::operator<<
                                   (pMVar9,(char (*) [57])
                                           "] does not meet the minimum specification requirements ["
                                   );
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&runs[uVar13].gl_enum);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29ea7ce);
                tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&to_id);
                pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar10,
                           "GL constant value does not meet minimum specification requirements",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3d1);
                __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              (*local_30->unmapBuffer)(0x8c8e);
              GVar5 = (*local_30->getError)();
              glu::checkError(GVar5,"glUnmapBuffer() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3d5);
            }
            for (result_value = 0; (uint)result_value < 2; result_value = result_value + 1) {
              if (result_value == 0) {
                local_e48 = this->m_cs_to_id;
              }
              else {
                local_e48 = this->m_fbo_draw_to_id;
              }
              local_8f8 = local_e48;
              if (((result_value != 0) || ((*(byte *)shader_bodies[5]._8_8_ & 1) != 0)) &&
                 ((result_value != 1 || ((*(byte *)(shader_bodies[5]._8_8_ + 1) & 1) != 0)))) {
                local_8fc = 0;
                (*local_30->framebufferTexture2D)(0x8ca8,0x8ce0,0xde1,local_e48,0);
                GVar5 = (*local_30->getError)();
                glu::checkError(GVar5,"glFramebufferTexture2D() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,1000);
                (*local_30->finish)();
                GVar5 = (*local_30->getError)();
                glu::checkError(GVar5,"glMemoryBarrier() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3ed);
                (*local_30->readPixels)(0,0,1,1,0x8d94,0x1404,&local_8fc);
                GVar5 = (*local_30->getError)();
                glu::checkError(GVar5,"glReadPixels() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3f4);
                if (local_8fc != *(int *)((long)&runs[uVar13].essl_token_value + 4)) {
                  pTVar8 = tcu::TestContext::getLog
                                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx
                                     );
                  tcu::TestLog::operator<<
                            (&local_a80,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (&local_a80,(char **)&runs[uVar13].min_value);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (pMVar9,(char (*) [53])
                                             " value accessible to the compute / fragment shader [")
                  ;
                  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_8fc);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (pMVar9,(char (*) [55])
                                             "] does not match the one reported by glGetIntegerv() ["
                                     );
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (pMVar9,(int *)((long)&runs[uVar13].essl_token_value + 4));
                  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29ea7ce);
                  tcu::MessageBuilder::operator<<
                            (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_a80);
                  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar10,"GL constant value does not match the ES SL equivalent",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x400);
                  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                if (local_8fc < (int)runs[uVar13].gl_enum) {
                  pTVar8 = tcu::TestContext::getLog
                                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx
                                     );
                  tcu::TestLog::operator<<
                            (&local_c00,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (&local_c00,(char **)&runs[uVar13].min_value);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (pMVar9,(char (*) [53])
                                             " value accessible to the compute / fragment shader [")
                  ;
                  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_8fc);
                  pMVar9 = tcu::MessageBuilder::operator<<
                                     (pMVar9,(char (*) [57])
                                             "] does not meet the minimum specification requirements ["
                                     );
                  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&runs[uVar13].gl_enum);
                  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29ea7ce);
                  tcu::MessageBuilder::operator<<
                            (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_c00);
                  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar10,
                             "GL constant value does not meet minimum specification requirements",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x40d);
                  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
              }
            }
            (*local_30->bufferSubData)(0x8c8e,0,0x40,"");
            GVar5 = (*local_30->getError)();
            glu::checkError(GVar5,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x416);
            aGStack_c18[0] = 0;
            aGStack_c18[1] = 0;
            clear_values[0] = 0;
            clear_values[1] = 0;
            (*local_30->clearBufferiv)(0x1800,0,aGStack_c18);
            GVar5 = (*local_30->getError)();
            glu::checkError(GVar5,"glClearBufferiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x41d);
            if (this->m_po_id != 0) {
              (*local_30->deleteProgram)(this->m_po_id);
              this->m_po_id = 0;
            }
            std::__cxx11::string::~string(local_518);
            std::__cxx11::string::~string(local_4f0);
            std::__cxx11::string::~string(local_4c8);
            std::__cxx11::string::~string(local_4a0);
            std::__cxx11::string::~string(local_478);
            std::__cxx11::string::~string(local_450);
          }
          else {
            pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
            requiredApiType = glu::ApiType::core(4,3);
            bVar3 = glu::contextSupports(ctxType,requiredApiType);
            if (bVar3) goto LAB_00dfb526;
            pCVar7 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
            bVar3 = glu::ContextInfo::isExtensionSupported(pCVar7,"GL_ARB_compute_shader");
            if (bVar3) goto LAB_00dfb526;
          }
LAB_00dfca82:
        }
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3a0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_3a0,(char (*) [37])"glGetIntegerv() returned error code ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c3fdfc);
      EVar15 = glu::getErrorStr(gl_max_combined_clip_and_cull_distances_value);
      local_3b0.m_getName = EVar15.m_getName;
      local_3b0.m_value = EVar15.m_value;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_3b0);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [75])
                                 "] for GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query instead of GL_NO_ERROR"
                         );
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_200,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_200,(char (*) [37])"glGetIntegerv() returned error code ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c3fdfc);
    EVar15 = glu::getErrorStr(gl_max_combined_clip_and_cull_distances_value);
    local_220 = EVar15.m_getName;
    local_218 = EVar15.m_value;
    local_210.m_getName = local_220;
    local_210.m_value = local_218;
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_210);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [57])
                               "] for GL_MAX_CULL_DISTANCES query instead of GL_NO_ERROR");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_200);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::APICoverageTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* Check that calling GetIntegerv with MAX_CULL_DISTANCES doesn't generate
	 * any errors and returns a value at least 8.
	 *
	 * Check that calling GetIntegerv with MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * doesn't generate any errors and returns a value at least 8.
	 *
	 */
	glw::GLint error_code									 = GL_NO_ERROR;
	glw::GLint gl_max_cull_distances_value					 = 0;
	glw::GLint gl_max_combined_clip_and_cull_distances_value = 0;

	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for GL_MAX_CULL_DISTANCES"
																	 " query instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for "
																	 "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query "
																	 "instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	/* Before we proceed with the two other tests, initialize a buffer & a texture
	 * object we will need to capture data from the programs */
	static const glw::GLuint bo_size = sizeof(int) * 4 /* components */ * 4 /* result points */;

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.genFramebuffers(1, &m_fbo_draw_id);
	gl.genFramebuffers(1, &m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call(s) failed.");

	gl.genTextures(1, &m_cs_to_id);
	gl.genTextures(1, &m_fbo_draw_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() or glBindBufferBase() call(s) failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	for (glw::GLuint n_to_id = 0; n_to_id < 2; /* CS, FBO */ ++n_to_id)
	{
		gl.bindTexture(GL_TEXTURE_2D, (n_to_id == 0) ? m_cs_to_id : m_fbo_draw_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
						GL_R32I, 1,		  /* width */
						1);				  /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");
	}

	gl.bindImageTexture(0,			   /* unit */
						m_cs_to_id, 0, /* level */
						GL_FALSE,	  /* layered */
						0,			   /* layer */
						GL_WRITE_ONLY, GL_R32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_fbo_draw_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.viewport(0,  /* x */
				0,  /* y */
				1,  /* width */
				1); /* height */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* There are two new GL constants, where value we need to verify */
	struct _run
	{
		const glw::GLchar* essl_token_value;
		glw::GLenum		   gl_enum;
		glw::GLint		   gl_value;
		glw::GLint		   min_value;
		const glw::GLchar* name;
	} runs[] = { { "gl_MaxCullDistances", GL_MAX_CULL_DISTANCES, gl_max_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_CULL_DISTANCES" },
				 { "gl_MaxCombinedClipAndCullDistances", GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES,
				   gl_max_combined_clip_and_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES" } };

	static const glw::GLuint n_runs = sizeof(runs) / sizeof(runs[0]);

	for (glw::GLuint n_run = 0; n_run < n_runs; ++n_run)
	{
		_run& current_run = runs[n_run];

		static const struct _stage
		{
			bool use_cs;
			bool use_fs;
			bool use_gs;
			bool use_tc;
			bool use_te;
			bool use_vs;

			const glw::GLchar* fs_input;
			const glw::GLchar* gs_input;
			const glw::GLchar* tc_input;
			const glw::GLchar* te_input;

			const glw::GLchar* tf_output_name;
			const glw::GLenum  tf_mode;

			glw::GLenum draw_call_mode;
			glw::GLuint n_draw_call_vertices;
		} stages[] = { /* CS only test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   true, false, false, false, false, false,

						   NULL,	/* fs_input             */
						   NULL,	/* gs_input             */
						   NULL,	/* tc_input             */
						   NULL,	/* te_input             */
						   NULL,	/* tf_output_name       */
						   GL_NONE, /* tf_mode              */
						   GL_NONE, /* draw_call_mode       */
						   0,		/* n_draw_call_vertices */
					   },
					   /* VS+GS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, true, true, true,

						   "out_gs",	 /* fs_input             */
						   "out_te",	 /* gs_input             */
						   "out_vs",	 /* tc_input             */
						   "out_tc",	 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_PATCHES,   /* draw_call_mode       */
						   3,			 /* n_draw_call_vertices */
					   },
					   /* VS+GS+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, false, false, true,

						   "out_gs",	 /* fs_input             */
						   "out_vs",	 /* gs_input             */
						   NULL,		 /* tc_input             */
						   NULL,		 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_POINTS,	/* draw_call_mode       */
						   1,			 /* n_draw_call_vertices */
					   },
					   /* VS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, false, true, true, true,

						   "out_te",   /* fs_input             */
						   NULL,	   /* gs_input             */
						   "out_vs",   /* tc_input             */
						   "out_tc",   /* te_input             */
						   "out_te",   /* tf_output_name       */
						   GL_POINTS,  /* tf_mode              */
						   GL_PATCHES, /* draw_call_mode       */
						   3		   /* n_draw_call_vertices */
					   },
					   /* VS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, false, false, false, false, true,

						   "out_vs",  /* fs_input             */
						   NULL,	  /* gs_input             */
						   NULL,	  /* tc_input             */
						   NULL,	  /* te_input             */
						   "out_vs",  /* tf_output_name       */
						   GL_POINTS, /* tf_mode              */
						   GL_POINTS, /* draw_call_mode       */
						   1		  /* n_draw_call_vertices */
					   }
		};
		const glw::GLuint n_stages = sizeof(stages) / sizeof(stages[0]);

		/* Run through all test stages */
		for (glw::GLuint n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Check for OpenGL feature support */
			if (stages[n_stage].use_cs)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
				{
					continue; // no compute shader support
				}
			}
			if (stages[n_stage].use_tc || stages[n_stage].use_te)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_tessellation_shader"))
				{
					continue; // no tessellation shader support
				}
			}

			/* Check that use of the GLSL built-in constant gl_MaxCullDistance in any
			 * shader stage (including compute shader) does not affect the shader
			 * compilation & program linking process.
			 */
			static const glw::GLchar* cs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_compute_shader          : require\n"
				"#extension GL_ARB_cull_distance           : require\n"
				"#extension GL_ARB_shader_image_load_store : require\n"
				"\n"
				"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
				"\n"
				"layout(r32i) uniform writeonly iimage2D result;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    imageStore(result, ivec2(0),ivec4(TOKEN) );\n"
				"}\n";
			std::string cs_body = cs_body_template;

			static const glw::GLchar* fs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat in  int INPUT_FS_NAME;\n"
														 "out int out_fs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    if (INPUT_FS_NAME == TOKEN)\n"
														 "    {\n"
														 "        out_fs = TOKEN;\n"
														 "    }\n"
														 "    else\n"
														 "    {\n"
														 "        out_fs = -1;\n"
														 "    }\n"
														 "}\n";
			std::string fs_body = fs_body_template;

			static const glw::GLchar* gs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_GS_NAME[];\n"
				"flat out int out_gs;\n"
				"\n"
				"layout(points)                           in;\n"
				"layout(triangle_strip, max_vertices = 4) out;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_GS_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				/* Draw a full-screen quad */
				"    gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"    EndPrimitive();\n"
				"}\n";
			std::string gs_body = gs_body_template;

			static const glw::GLchar* tc_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"flat in  int INPUT_TC_NAME[];\n"
				"flat out int out_tc       [];\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TC_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				"    out_tc[gl_InvocationID]             = result_value;\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0]                = 1.0;\n"
				"    gl_TessLevelInner[1]                = 1.0;\n"
				"    gl_TessLevelOuter[0]                = 1.0;\n"
				"    gl_TessLevelOuter[1]                = 1.0;\n"
				"    gl_TessLevelOuter[2]                = 1.0;\n"
				"    gl_TessLevelOuter[3]                = 1.0;\n"
				"}\n";
			std::string tc_body = tc_body_template;

			static const glw::GLchar* te_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_TE_NAME[];\n"
				"flat out int out_te;\n"
				"\n"
				"layout(isolines, point_mode) in;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TE_NAME[0] == TOKEN) ? TOKEN : 0;\n"
				"\n"
				"    out_te = result_value;\n"
				"\n"
				"    gl_Position = vec4(0.0, 0.0, 0.0, 1.);\n"
				"}\n";
			std::string te_body = te_body_template;

			static const glw::GLchar* vs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat out int out_vs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
														 "    out_vs      = TOKEN;\n"
														 "}\n";
			std::string vs_body = vs_body_template;

			const _stage& current_stage = stages[n_stage];

			/* Build shader bodies */
			struct _shader_body
			{
				std::string* body_ptr;
				glw::GLenum  gl_type;
			} shader_bodies[] = { { &cs_body, GL_COMPUTE_SHADER },		   { &fs_body, GL_FRAGMENT_SHADER },
								  { &gs_body, GL_GEOMETRY_SHADER },		   { &tc_body, GL_TESS_CONTROL_SHADER },
								  { &te_body, GL_TESS_EVALUATION_SHADER }, { &vs_body, GL_VERTEX_SHADER } };
			static const glw::GLchar* input_fs_token_string = "INPUT_FS_NAME";
			static const glw::GLchar* input_gs_token_string = "INPUT_GS_NAME";
			static const glw::GLchar* input_te_token_string = "INPUT_TE_NAME";
			static const glw::GLchar* input_tc_token_string = "INPUT_TC_NAME";
			static const glw::GLuint  n_shader_bodies		= sizeof(shader_bodies) / sizeof(shader_bodies[0]);

			std::size_t				  token_position = std::string::npos;
			static const glw::GLchar* token_string   = "TOKEN";

			for (glw::GLuint n_shader_body = 0; n_shader_body < n_shader_bodies; ++n_shader_body)
			{
				_shader_body& current_body = shader_bodies[n_shader_body];

				/* Is this stage actually used? */
				if (((current_body.gl_type == GL_COMPUTE_SHADER) && (!current_stage.use_cs)) ||
					((current_body.gl_type == GL_FRAGMENT_SHADER) && (!current_stage.use_fs)) ||
					((current_body.gl_type == GL_TESS_CONTROL_SHADER) && (!current_stage.use_tc)) ||
					((current_body.gl_type == GL_TESS_EVALUATION_SHADER) && (!current_stage.use_te)) ||
					((current_body.gl_type == GL_VERTEX_SHADER) && (!current_stage.use_vs)))
				{
					/* Skip the iteration. */
					continue;
				}

				/* Iterate over all token and replace them with stage-specific values */
				struct _token_value_pair
				{
					const glw::GLchar* token;
					const glw::GLchar* value;
				} token_value_pairs[] = {
					/* NOTE: The last entry is filled by the switch() block below */
					{ token_string, current_run.essl_token_value },
					{ NULL, NULL },
				};

				const size_t n_token_value_pairs = sizeof(token_value_pairs) / sizeof(token_value_pairs[0]);

				switch (current_body.gl_type)
				{
				case GL_COMPUTE_SHADER:
				case GL_VERTEX_SHADER:
					break;

				case GL_FRAGMENT_SHADER:
				{
					token_value_pairs[1].token = input_fs_token_string;
					token_value_pairs[1].value = current_stage.fs_input;

					break;
				}

				case GL_GEOMETRY_SHADER:
				{
					token_value_pairs[1].token = input_gs_token_string;
					token_value_pairs[1].value = current_stage.gs_input;

					break;
				}

				case GL_TESS_CONTROL_SHADER:
				{
					token_value_pairs[1].token = input_tc_token_string;
					token_value_pairs[1].value = current_stage.tc_input;

					break;
				}

				case GL_TESS_EVALUATION_SHADER:
				{
					token_value_pairs[1].token = input_te_token_string;
					token_value_pairs[1].value = current_stage.te_input;

					break;
				}

				default:
					TCU_FAIL("Unrecognized shader body type");
				}

				for (glw::GLuint n_pair = 0; n_pair < n_token_value_pairs; ++n_pair)
				{
					const _token_value_pair& current_pair = token_value_pairs[n_pair];

					if (current_pair.token == NULL || current_pair.value == NULL)
					{
						continue;
					}

					while ((token_position = current_body.body_ptr->find(current_pair.token)) != std::string::npos)
					{
						current_body.body_ptr->replace(token_position, strlen(current_pair.token), current_pair.value);
					}
				} /* for (all token+value pairs) */
			}	 /* for (all sader bodies) */

			/* Build the test program */
			CullDistance::Utilities::buildProgram(
				gl, m_testCtx, current_stage.use_cs ? cs_body.c_str() : DE_NULL,
				current_stage.use_fs ? fs_body.c_str() : DE_NULL, current_stage.use_gs ? gs_body.c_str() : DE_NULL,
				current_stage.use_tc ? tc_body.c_str() : DE_NULL, current_stage.use_te ? te_body.c_str() : DE_NULL,
				current_stage.use_vs ? vs_body.c_str() : DE_NULL, (current_stage.tf_output_name != NULL) ? 1 : 0,
				(const glw::GLchar**)&current_stage.tf_output_name, &m_po_id);

			/* Bind the test program */
			DE_ASSERT(m_po_id != 0);

			gl.useProgram(m_po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			/* Execute the draw call. Transform Feed-back should be enabled for all iterations
			 * par the CS one, since we use a different tool to capture the result data in the
			 * latter case.
			 */
			if (!current_stage.use_cs)
			{
				gl.beginTransformFeedback(current_stage.tf_mode);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

				gl.drawArrays(current_stage.draw_call_mode, 0,	 /* first */
							  current_stage.n_draw_call_vertices); /* count */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");
			} /* if (uses_tf) */
			else
			{
				gl.dispatchCompute(1,  /* num_groups_x */
								   1,  /* num_groups_y */
								   1); /* num_groups_z */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");
			}

			/* Verify the result values */
			if (!current_stage.use_cs)
			{
				glw::GLint* result_data_ptr = DE_NULL;

				/* Retrieve the data captured by Transform Feedback */
				result_data_ptr = (glw::GLint*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																 sizeof(unsigned int) * 1, GL_MAP_READ_BIT);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

				if (*result_data_ptr != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not match the one reported by glGetIntegerv() "
															  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (*result_data_ptr < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not meet the minimum specification requirements "
															  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
			}

			for (glw::GLuint n_stage_internal = 0; n_stage_internal < 2; /* CS, FS write to separate textures */
				 ++n_stage_internal)
			{
				glw::GLuint to_id = (n_stage_internal == 0) ? m_cs_to_id : m_fbo_draw_to_id;

				if (((n_stage_internal == 0) && (!current_stage.use_cs)) ||
					((n_stage_internal == 1) && (!current_stage.use_fs)))
				{
					/* Skip the iteration */
					continue;
				}

				/* Check the image data the test CS / FS should have written */
				glw::GLint result_value = 0;

				gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, to_id, 0); /* level */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

				/* NOTE: We're using our custom read framebuffer here, so we'll be reading
				 *       from the texture, that the writes have been issued to earlier. */
				gl.finish();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

				gl.readPixels(0, /* x */
							  0, /* y */
							  1, /* width */
							  1, /* height */
							  GL_RED_INTEGER, GL_INT, &result_value);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

				if (result_value != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not match the one reported by glGetIntegerv() "
														  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (result_value < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not meet the minimum specification requirements "
														  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}
			}

			/* Clear the data buffer before we continue */
			static const glw::GLubyte bo_clear_data[bo_size] = { 0 };

			gl.bufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
							 bo_size, bo_clear_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* Clear the texture mip-map before we continue */
			glw::GLint clear_values[4] = { 0, 0, 0, 0 };

			gl.clearBufferiv(GL_COLOR, 0, /* drawbuffer */
							 clear_values);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferiv() call failed.");

			/* Release program before we move on to the next iteration */
			if (m_po_id != 0)
			{
				gl.deleteProgram(m_po_id);

				m_po_id = 0;
			}
		} /* for (all stages) */
	}	 /* for (both runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}